

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::Reserve(RepeatedPtrFieldBase *this,int new_size)

{
  undefined1 auVar1 [16];
  int *piVar2;
  ulong uVar3;
  void **ppvVar4;
  int local_24;
  void **local_20;
  void **old_elements;
  RepeatedPtrFieldBase *pRStack_10;
  int new_size_local;
  RepeatedPtrFieldBase *this_local;
  
  if (this->total_size_ < new_size) {
    local_20 = this->elements_;
    local_24 = this->total_size_ << 1;
    old_elements._4_4_ = new_size;
    pRStack_10 = this;
    piVar2 = std::max<int>(&local_24,(int *)((long)&old_elements + 4));
    piVar2 = std::max<int>(&kMinRepeatedFieldAllocationSize,piVar2);
    this->total_size_ = *piVar2;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)this->total_size_;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    ppvVar4 = (void **)operator_new__(uVar3);
    this->elements_ = ppvVar4;
    if ((local_20 != (void **)0x0) &&
       (memcpy(this->elements_,local_20,(long)this->allocated_size_ << 3), local_20 != (void **)0x0)
       ) {
      operator_delete__(local_20);
    }
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Reserve(int new_size) {
  if (total_size_ >= new_size) return;

  void** old_elements = elements_;
  total_size_ = max(kMinRepeatedFieldAllocationSize,
                    max(total_size_ * 2, new_size));
  elements_ = new void*[total_size_];
  if (old_elements != NULL) {
    memcpy(elements_, old_elements, allocated_size_ * sizeof(elements_[0]));
    delete [] old_elements;
  }
}